

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::EnumValueOptions::_InternalSerialize
          (EnumValueOptions *this,uint8 *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  Type *this_00;
  uint uVar4;
  uint uVar5;
  int index;
  uint8 *puVar6;
  uint8 *puVar7;
  
  if (((this->_has_bits_).has_bits_[0] & 1) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = this->deprecated_;
    *target = '\b';
    target[1] = bVar1;
    target = target + 2;
  }
  iVar2 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    index = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_00 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                          (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,index);
      target[0] = 0xba;
      target[1] = '>';
      uVar4 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar4 < 0x80) {
        target[2] = (byte)uVar4;
        puVar6 = target + 3;
      }
      else {
        target[2] = (byte)uVar4 | 0x80;
        if (uVar4 < 0x4000) {
          target[3] = (uint8)(uVar4 >> 7);
          puVar6 = target + 4;
        }
        else {
          puVar6 = target + 4;
          uVar4 = uVar4 >> 7;
          do {
            puVar7 = puVar6;
            puVar7[-1] = (byte)uVar4 | 0x80;
            uVar5 = uVar4 >> 7;
            puVar6 = puVar7 + 1;
            bVar1 = 0x3fff < uVar4;
            uVar4 = uVar5;
          } while (bVar1);
          *puVar7 = (uint8)uVar5;
        }
      }
      target = UninterpretedOption::_InternalSerialize(this_00,puVar6,stream);
      index = index + 1;
    } while (index != iVar2);
  }
  puVar6 = internal::ExtensionSet::_InternalSerialize
                     (&this->_extensions_,1000,0x20000000,target,stream);
  pvVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    puVar6 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 8),puVar6,stream)
    ;
    return puVar6;
  }
  return puVar6;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* EnumValueOptions::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.EnumValueOptions)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional bool deprecated = 1 [default = false];
  if (cached_has_bits & 0x00000001u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(1, this->_internal_deprecated(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_uninterpreted_option_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(999, this->_internal_uninterpreted_option(i), target, stream);
  }

  // Extension range [1000, 536870912)
  target = _extensions_._InternalSerialize(
      1000, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.EnumValueOptions)
  return target;
}